

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreXmlSerializer::ReadBones(OgreXmlSerializer *this,Skeleton *skeleton)

{
  string *psVar1;
  pointer *pppBVar2;
  iterator __position;
  __normal_iterator<Assimp::Ogre::Bone_**,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
  __first;
  __normal_iterator<Assimp::Ogre::Bone_**,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
  __last;
  uint16_t uVar3;
  int iVar4;
  Logger *pLVar5;
  Bone *pBVar6;
  undefined4 extraout_var;
  string *psVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar8;
  runtime_error *prVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  Bone *bone;
  Bone *local_1f0;
  float local_1e8;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  Skeleton *local_1d8;
  float local_1cc;
  char *local_1c8 [2];
  char local_1b8 [16];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1d8 = skeleton;
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"  - Bones");
  NextNode_abi_cxx11_(this);
  psVar1 = &this->m_currentNodeName;
  iVar4 = std::__cxx11::string::compare((char *)psVar1);
  while (iVar4 == 0) {
    pBVar6 = (Bone *)operator_new(0xf8);
    Bone::Bone(pBVar6);
    local_1f0 = pBVar6;
    uVar3 = ReadAttribute<unsigned_short>(this,"id");
    local_1f0->id = uVar3;
    ReadAttribute<std::__cxx11::string>(local_1a8,this,"name");
    std::__cxx11::string::operator=((string *)&local_1f0->name,(string *)local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p);
    }
    while( true ) {
      NextNode_abi_cxx11_(this);
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)psVar1), iVar4 != 0)) &&
         (iVar4 = std::__cxx11::string::compare((char *)psVar1), iVar4 != 0)) break;
      iVar4 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar4 == 0) {
        fVar12 = ReadAttribute<float>(this,"x");
        (local_1f0->position).x = fVar12;
        fVar12 = ReadAttribute<float>(this,"y");
        (local_1f0->position).y = fVar12;
        fVar12 = ReadAttribute<float>(this,"z");
        (local_1f0->position).z = fVar12;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar4 == 0) {
          local_1dc = ReadAttribute<float>(this,"angle");
          psVar7 = NextNode_abi_cxx11_(this);
          iVar4 = std::__cxx11::string::compare((char *)psVar7);
          if (iVar4 != 0) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"No axis specified for bone rotation in bone ",0x2c);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__cxx11::stringbuf::str();
            std::runtime_error::runtime_error(prVar9,(string *)local_1c8);
            *(undefined ***)prVar9 = &PTR__runtime_error_00896c98;
            __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          local_1e4 = ReadAttribute<float>(this,"x");
          local_1e8 = ReadAttribute<float>(this,"y");
          local_1e0 = ReadAttribute<float>(this,"z");
          fVar12 = local_1e0 * local_1e0 + local_1e4 * local_1e4 + local_1e8 * local_1e8;
          if (fVar12 < 0.0) {
            fVar12 = sqrtf(fVar12);
          }
          else {
            fVar12 = SQRT(fVar12);
          }
          fVar12 = 1.0 / fVar12;
          local_1e4 = local_1e4 * fVar12;
          local_1e8 = local_1e8 * fVar12;
          local_1e0 = local_1e0 * fVar12;
          local_1dc = local_1dc * 0.5;
          local_1cc = sinf(local_1dc);
          fVar12 = cosf(local_1dc);
          (local_1f0->rotation).w = fVar12;
          (local_1f0->rotation).x = local_1e4 * local_1cc;
          (local_1f0->rotation).y = local_1e8 * local_1cc;
          (local_1f0->rotation).z = local_1e0 * local_1cc;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar4 == 0) {
            iVar4 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"factor");
            if (CONCAT44(extraout_var,iVar4) == 0) {
              iVar4 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"x");
              if (CONCAT44(extraout_var_00,iVar4) != 0) {
                fVar12 = ReadAttribute<float>(this,"x");
                (local_1f0->scale).x = fVar12;
              }
              iVar4 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"y");
              if (CONCAT44(extraout_var_01,iVar4) != 0) {
                fVar12 = ReadAttribute<float>(this,"y");
                (local_1f0->scale).y = fVar12;
              }
              iVar4 = (*this->m_reader->_vptr_IIrrXMLReader[7])(this->m_reader,"z");
              if (CONCAT44(extraout_var_02,iVar4) != 0) {
                fVar12 = ReadAttribute<float>(this,"z");
                (local_1f0->scale).z = fVar12;
              }
            }
            else {
              fVar12 = ReadAttribute<float>(this,"factor");
              (local_1f0->scale).x = fVar12;
              (local_1f0->scale).y = fVar12;
              (local_1f0->scale).z = fVar12;
            }
          }
        }
      }
    }
    __position._M_current =
         (local_1d8->bones).
         super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (local_1d8->bones).
        super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::Ogre::Bone*,std::allocator<Assimp::Ogre::Bone*>>::
      _M_realloc_insert<Assimp::Ogre::Bone*const&>
                ((vector<Assimp::Ogre::Bone*,std::allocator<Assimp::Ogre::Bone*>> *)local_1d8,
                 __position,&local_1f0);
    }
    else {
      *__position._M_current = local_1f0;
      pppBVar2 = &(local_1d8->bones).
                  super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppBVar2 = *pppBVar2 + 1;
    }
    iVar4 = std::__cxx11::string::compare((char *)psVar1);
  }
  __first._M_current =
       (local_1d8->bones).
       super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (local_1d8->bones).
       super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar8 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar11 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Assimp::Ogre::Bone**,std::vector<Assimp::Ogre::Bone*,std::allocator<Assimp::Ogre::Bone*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Assimp::Ogre::Bone*,Assimp::Ogre::Bone*)>>
              (__first,__last,(ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(Assimp::Ogre::Bone_*,_Assimp::Ogre::Bone_*)>)0x48bdd3);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Assimp::Ogre::Bone**,std::vector<Assimp::Ogre::Bone*,std::allocator<Assimp::Ogre::Bone*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Assimp::Ogre::Bone*,Assimp::Ogre::Bone*)>>
              (__first,__last,
               (_Iter_comp_iter<bool_(*)(Assimp::Ogre::Bone_*,_Assimp::Ogre::Bone_*)>)0x48bdd3);
  }
  lVar11 = (long)(local_1d8->bones).
                 super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(local_1d8->bones).
                 super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar11 != 0) {
    lVar11 = lVar11 >> 3;
    lVar10 = 0;
    do {
      pBVar6 = (local_1d8->bones).
               super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar10];
      pLVar5 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[5]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (char (*) [5])"    ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(pBVar6->name)._M_dataplus._M_p,
                 (pBVar6->name)._M_string_length);
      std::__cxx11::stringbuf::str();
      Logger::debug(pLVar5,local_1c8[0]);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0]);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((uint16_t)lVar10 != pBVar6->id) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "Bone ids are not in sequence starting from 0. Missing index ",0x3c);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar9,(string *)local_1c8);
        *(undefined ***)prVar9 = &PTR__runtime_error_00896c98;
        __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar10 = lVar10 + 1;
    } while (lVar11 + (ulong)(lVar11 == 0) != lVar10);
  }
  return;
}

Assistant:

void OgreXmlSerializer::ReadBones(Skeleton *skeleton)
{
    ASSIMP_LOG_DEBUG("  - Bones");

    NextNode();
    while(m_currentNodeName == nnBone)
    {
        Bone *bone = new Bone();
        bone->id = ReadAttribute<uint16_t>("id");
        bone->name = ReadAttribute<std::string>("name");

        NextNode();
        while(m_currentNodeName == nnPosition ||
              m_currentNodeName == nnRotation ||
              m_currentNodeName == nnScale)
        {
            if (m_currentNodeName == nnPosition)
            {
                bone->position.x = ReadAttribute<float>(anX);
                bone->position.y = ReadAttribute<float>(anY);
                bone->position.z = ReadAttribute<float>(anZ);
            }
            else if (m_currentNodeName == nnRotation)
            {
                float angle = ReadAttribute<float>("angle");

                if (NextNode() != nnAxis) {
                    throw DeadlyImportError(Formatter::format() << "No axis specified for bone rotation in bone " << bone->id);
                }

                aiVector3D axis;
                axis.x = ReadAttribute<float>(anX);
                axis.y = ReadAttribute<float>(anY);
                axis.z = ReadAttribute<float>(anZ);

                bone->rotation = aiQuaternion(axis, angle);
            }
            else if (m_currentNodeName == nnScale)
            {
                /// @todo Implement taking scale into account in matrix/pose calculations!
                if (HasAttribute("factor"))
                {
                    float factor = ReadAttribute<float>("factor");
                    bone->scale.Set(factor, factor, factor);
                }
                else
                {
                    if (HasAttribute(anX))
                        bone->scale.x = ReadAttribute<float>(anX);
                    if (HasAttribute(anY))
                        bone->scale.y = ReadAttribute<float>(anY);
                    if (HasAttribute(anZ))
                        bone->scale.z = ReadAttribute<float>(anZ);
                }
            }

            NextNode();
        }

        skeleton->bones.push_back(bone);
    }

    // Order bones by Id
    std::sort(skeleton->bones.begin(), skeleton->bones.end(), BoneCompare);

    // Validate that bone indexes are not skipped.
    /** @note Left this from original authors code, but not sure if this is strictly necessary
        as per the Ogre skeleton spec. It might be more that other (later) code in this imported does not break. */
    for (size_t i=0, len=skeleton->bones.size(); i<len; ++i)
    {
        Bone *b = skeleton->bones[i];
        ASSIMP_LOG_DEBUG_F( "    ", b->id, " ", b->name);

        if (b->id != static_cast<uint16_t>(i)) {
            throw DeadlyImportError(Formatter::format() << "Bone ids are not in sequence starting from 0. Missing index " << i);
        }
    }
}